

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O1

int cnn::rand0n(int n)

{
  float fVar1;
  
  if (0 < n) {
    fVar1 = std::
            generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                      (rndeng);
    while ((int)(fVar1 * (float)n) == n) {
      fVar1 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (rndeng);
    }
    return (int)(fVar1 * (float)n);
  }
  __assert_fail("n > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/tensor.cc"
                ,0x90,"int cnn::rand0n(int)");
}

Assistant:

int rand0n(int n) {
  assert(n > 0);
  int x = rand01() * n;
  while(n == x) { x = rand01() * n; }
  return x;
}